

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<int>,duckdb::MinMaxFixedValue<float>,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  BinaryAggregateHeap<float,_int,_duckdb::LessThan> *this;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  STORAGE_TYPE *pSVar4;
  idx_t iVar5;
  long lVar6;
  long lVar7;
  idx_t iVar8;
  idx_t i_1;
  ulong uVar9;
  UnifiedVectorFormat state_format;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar1 = duckdb::ListVector::GetListSize(result);
  lVar6 = 0;
  for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
    iVar8 = iVar5;
    if (*local_78 != 0) {
      iVar8 = (idx_t)*(uint *)(*local_78 + iVar5 * 4);
    }
    lVar6 = lVar6 + *(long *)(*(long *)(local_70 + iVar8 * 8) + 0x10);
  }
  duckdb::ListVector::Reserve(result,lVar6 + uVar1);
  lVar6 = *(long *)(result + 0x20);
  lVar2 = duckdb::ListVector::GetEntry(result);
  for (uVar9 = 0; uVar9 != count; uVar9 = uVar9 + 1) {
    uVar3 = uVar9;
    if (*local_78 != 0) {
      uVar3 = (ulong)*(uint *)(*local_78 + uVar9 * 4);
    }
    this = *(BinaryAggregateHeap<float,_int,_duckdb::LessThan> **)(local_70 + uVar3 * 8);
    if (((char)this[1].capacity == '\x01') && (iVar5 = this->size, iVar5 != 0)) {
      lVar7 = (uVar9 + offset) * 0x10;
      *(ulong *)(lVar6 + lVar7) = uVar1;
      *(idx_t *)(lVar6 + 8 + lVar7) = iVar5;
      pSVar4 = BinaryAggregateHeap<float,_int,_duckdb::LessThan>::SortAndGetHeap(this);
      iVar5 = this->size;
      lVar7 = *(long *)(lVar2 + 0x20);
      for (iVar8 = 0; iVar5 != iVar8; iVar8 = iVar8 + 1) {
        *(int *)(uVar1 * 4 + lVar7 + iVar8 * 4) = pSVar4[iVar8].second.value;
      }
      uVar1 = uVar1 + iVar8;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),uVar9 + offset);
    }
  }
  duckdb::ListVector::SetListSize(result,uVar1);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}